

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O1

void __thiscall
Lodtalk::AST::MethodHeader::MethodHeader
          (MethodHeader *this,string *selector,ArgumentList *arguments)

{
  pointer pcVar1;
  
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__MethodHeader_00164170;
  (this->selector)._M_dataplus._M_p = (pointer)&(this->selector).field_2;
  pcVar1 = (selector->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->selector,pcVar1,pcVar1 + selector->_M_string_length);
  this->arguments = arguments;
  return;
}

Assistant:

MethodHeader::MethodHeader(const std::string &selector, ArgumentList *arguments)
	: selector(selector), arguments(arguments)
{
}